

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O2

pair<CMutableTransaction,_long> * __thiscall
TestChain100Setup::CreateValidTransaction
          (pair<CMutableTransaction,_long> *__return_storage_ptr__,TestChain100Setup *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *input_transactions,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,int input_height
          ,vector<CKey,_std::allocator<CKey>_> *input_signing_keys,
          vector<CTxOut,_std::allocator<CTxOut>_> *outputs,optional<CFeeRate> *feerate,
          optional<unsigned_int> *fee_output)

{
  long lVar1;
  pointer pCVar2;
  CKey *pCVar3;
  pointer psVar4;
  bool bVar5;
  long lVar6;
  uint *puVar7;
  CFeeRate *this_00;
  int64_t iVar8;
  CAmount CVar9;
  pointer pCVar10;
  CKey *input_signing_key;
  CKey *key;
  pointer pCVar11;
  long lVar12;
  shared_ptr<const_CTransaction> *input_transaction;
  pointer psVar13;
  long in_FS_OFFSET;
  CCoinsView coins_view;
  CMutableTransaction mempool_txn;
  undefined1 local_378 [48];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_348 [2];
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  input_coins;
  CCoinsViewCache coins_cache;
  FillableSigningProvider keystore;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&mempool_txn);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::reserve
            (&mempool_txn.vin,
             ((long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                   super__Vector_impl_data._M_start) / 0x24);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::reserve
            (&mempool_txn.vout,
             ((long)(outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                   super__Vector_impl_data._M_start) / 0x28);
  pCVar2 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar11 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                 super__Vector_impl_data._M_start; pCVar11 != pCVar2; pCVar11 = pCVar11 + 1) {
    coins_cache.m_deterministic = false;
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    coins_cache.hashBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    coins_cache.super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView = (_func_int **)0x0;
    coins_cache.super_CCoinsViewBacked.base = (CCoinsView *)0x0;
    std::vector<CTxIn,std::allocator<CTxIn>>::
    emplace_back<COutPoint_const&,CScript,unsigned_int_const&>
              ((vector<CTxIn,std::allocator<CTxIn>> *)&mempool_txn,pCVar11,(CScript *)&coins_cache,
               &MAX_BIP125_RBF_SEQUENCE);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&coins_cache);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=(&mempool_txn.vout,outputs);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  pCVar3 = (input_signing_keys->super__Vector_base<CKey,_std::allocator<CKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (key = (input_signing_keys->super__Vector_base<CKey,_std::allocator<CKey>_>)._M_impl.
             super__Vector_impl_data._M_start; key != pCVar3; key = key + 1) {
    FillableSigningProvider::AddKey(&keystore,key);
  }
  coins_view._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_01149610;
  CCoinsViewCache::CCoinsViewCache(&coins_cache,&coins_view,false);
  psVar4 = (input_transactions->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (psVar13 = (input_transactions->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar4;
      psVar13 = psVar13 + 1) {
    AddCoins(&coins_cache,
             (psVar13->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             input_height,false);
  }
  input_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &input_coins._M_t._M_impl.super__Rb_tree_header._M_header;
  input_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  input_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  input_coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar2 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar12 = 0;
  input_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       input_coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pCVar11 = (inputs->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                 super__Vector_impl_data._M_start; pCVar11 != pCVar2; pCVar11 = pCVar11 + 1) {
    Coin::Coin((Coin *)&input_errors);
    bVar5 = CCoinsViewCache::GetCoin(&coins_cache,pCVar11,(Coin *)&input_errors);
    if (!bVar5) {
      __assert_fail("coins_cache.GetCoin(outpoint_to_spend, utxo_to_spend)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1b5,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    local_378._32_4_ = pCVar11->n;
    local_378._0_8_ = *(undefined8 *)(pCVar11->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
    ;
    local_378._8_8_ =
         *(undefined8 *)((pCVar11->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_378._16_8_ =
         *(undefined8 *)((pCVar11->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_378._24_8_ =
         *(undefined8 *)((pCVar11->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    Coin::Coin((Coin *)(local_378 + 0x28),(Coin *)&input_errors);
    std::
    _Rb_tree<COutPoint,std::pair<COutPoint_const,Coin>,std::_Select1st<std::pair<COutPoint_const,Coin>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,Coin>>>
    ::_M_insert_unique<std::pair<COutPoint_const,Coin>>
              ((_Rb_tree<COutPoint,std::pair<COutPoint_const,Coin>,std::_Select1st<std::pair<COutPoint_const,Coin>>,std::less<COutPoint>,std::allocator<std::pair<COutPoint_const,Coin>>>
                *)&input_coins,(pair<const_COutPoint,_Coin> *)local_378);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(local_348);
    lVar12 = lVar12 + input_errors._M_t._M_impl._0_8_;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               &input_errors._M_t._M_impl.super__Rb_tree_header);
  }
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &input_errors._M_t._M_impl.super__Rb_tree_header._M_header;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = SignTransaction(&mempool_txn,&keystore.super_SigningProvider,&input_coins,1,&input_errors)
  ;
  if (!bVar5) {
    __assert_fail("SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x1bc,
                  "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                 );
  }
  lVar6 = 0;
  for (pCVar10 = (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pCVar10 !=
      (outputs->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.super__Vector_impl_data
      ._M_finish; pCVar10 = pCVar10 + 1) {
    lVar6 = lVar6 + pCVar10->nValue;
  }
  lVar12 = lVar12 - lVar6;
  if ((feerate->super__Optional_base<CFeeRate,_true,_true>)._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged == true) {
    if ((fee_output->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      __assert_fail("fee_output.has_value()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1c3,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    puVar7 = std::optional<unsigned_int>::value(fee_output);
    if ((ulong)(((long)mempool_txn.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)mempool_txn.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x28) <= (ulong)*puVar7) {
      __assert_fail("fee_output.value() < mempool_txn.vout.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1c4,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    this_00 = std::optional<CFeeRate>::value(feerate);
    CTransaction::CTransaction((CTransaction *)local_378,&mempool_txn);
    iVar8 = GetVirtualTransactionSize((CTransaction *)local_378);
    CVar9 = CFeeRate::GetFee(this_00,(uint32_t)iVar8);
    CTransaction::~CTransaction((CTransaction *)local_378);
    if (CVar9 - lVar12 != 0 && lVar12 <= CVar9) {
      puVar7 = std::optional<unsigned_int>::value(fee_output);
      mempool_txn.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start[*puVar7].nValue =
           mempool_txn.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start[*puVar7].nValue - (CVar9 - lVar12);
      std::
      _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
      ::clear(&input_errors._M_t);
      bVar5 = SignTransaction(&mempool_txn,&keystore.super_SigningProvider,&input_coins,1,
                              (map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                               *)&input_errors._M_t);
      lVar12 = CVar9;
      if (!bVar5) {
        __assert_fail("SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                      ,0x1cd,
                      "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                     );
      }
    }
  }
  CMutableTransaction::CMutableTransaction(&__return_storage_ptr__->first,&mempool_txn);
  __return_storage_ptr__->second = lVar12;
  std::
  _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  ::~_Rb_tree(&input_errors._M_t);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::~_Rb_tree(&input_coins._M_t);
  CCoinsViewCache::~CCoinsViewCache(&coins_cache);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  CMutableTransaction::~CMutableTransaction(&mempool_txn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef>& input_transactions,
                                                                                  const std::vector<COutPoint>& inputs,
                                                                                  int input_height,
                                                                                  const std::vector<CKey>& input_signing_keys,
                                                                                  const std::vector<CTxOut>& outputs,
                                                                                  const std::optional<CFeeRate>& feerate,
                                                                                  const std::optional<uint32_t>& fee_output)
{
    CMutableTransaction mempool_txn;
    mempool_txn.vin.reserve(inputs.size());
    mempool_txn.vout.reserve(outputs.size());

    for (const auto& outpoint : inputs) {
        mempool_txn.vin.emplace_back(outpoint, CScript(), MAX_BIP125_RBF_SEQUENCE);
    }
    mempool_txn.vout = outputs;

    // - Add the signing key to a keystore
    FillableSigningProvider keystore;
    for (const auto& input_signing_key : input_signing_keys) {
        keystore.AddKey(input_signing_key);
    }
    // - Populate a CoinsViewCache with the unspent output
    CCoinsView coins_view;
    CCoinsViewCache coins_cache(&coins_view);
    for (const auto& input_transaction : input_transactions) {
        AddCoins(coins_cache, *input_transaction.get(), input_height);
    }
    // Build Outpoint to Coin map for SignTransaction
    std::map<COutPoint, Coin> input_coins;
    CAmount inputs_amount{0};
    for (const auto& outpoint_to_spend : inputs) {
        // - Use GetCoin to properly populate utxo_to_spend,
        Coin utxo_to_spend;
        assert(coins_cache.GetCoin(outpoint_to_spend, utxo_to_spend));
        input_coins.insert({outpoint_to_spend, utxo_to_spend});
        inputs_amount += utxo_to_spend.out.nValue;
    }
    // - Default signature hashing type
    int nHashType = SIGHASH_ALL;
    std::map<int, bilingual_str> input_errors;
    assert(SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors));
    CAmount current_fee = inputs_amount - std::accumulate(outputs.begin(), outputs.end(), CAmount(0),
        [](const CAmount& acc, const CTxOut& out) {
        return acc + out.nValue;
    });
    // Deduct fees from fee_output to meet feerate if set
    if (feerate.has_value()) {
        assert(fee_output.has_value());
        assert(fee_output.value() < mempool_txn.vout.size());
        CAmount target_fee = feerate.value().GetFee(GetVirtualTransactionSize(CTransaction{mempool_txn}));
        CAmount deduction = target_fee - current_fee;
        if (deduction > 0) {
            // Only deduct fee if there's anything to deduct. If the caller has put more fees than
            // the target feerate, don't change the fee.
            mempool_txn.vout[fee_output.value()].nValue -= deduction;
            // Re-sign since an output has changed
            input_errors.clear();
            assert(SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors));
            current_fee = target_fee;
        }
    }
    return {mempool_txn, current_fee};
}